

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::VerifyUtf8String
               (char *data,int size,Operation op,char *field_name)

{
  bool bVar1;
  char *pcVar2;
  LogMessage *pLVar3;
  char *value;
  LogFinisher local_79;
  string quoted_field_name;
  LogMessage local_58;
  
  bVar1 = IsStructurallyValidUTF8(data,size);
  if (!bVar1) {
    pcVar2 = (char *)0x0;
    if (op == SERIALIZE) {
      pcVar2 = "serializing";
    }
    value = "parsing";
    if (op != PARSE) {
      value = pcVar2;
    }
    std::__cxx11::string::string((string *)&quoted_field_name,"",(allocator *)&local_58);
    if (field_name != (char *)0x0) {
      StringPrintf_abi_cxx11_((string *)&local_58," \'%s\'",field_name);
      std::__cxx11::string::operator=((string *)&quoted_field_name,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x275);
    pLVar3 = LogMessage::operator<<(&local_58,"String field");
    pLVar3 = LogMessage::operator<<(pLVar3,&quoted_field_name);
    pLVar3 = LogMessage::operator<<(pLVar3," contains invalid ");
    pLVar3 = LogMessage::operator<<(pLVar3,"UTF-8 data when ");
    pLVar3 = LogMessage::operator<<(pLVar3,value);
    pLVar3 = LogMessage::operator<<(pLVar3," a protocol ");
    pLVar3 = LogMessage::operator<<
                       (pLVar3,"buffer. Use the \'bytes\' type if you intend to send raw ");
    pLVar3 = LogMessage::operator<<(pLVar3,"bytes. ");
    LogFinisher::operator=(&local_79,pLVar3);
    LogMessage::~LogMessage(&local_58);
    std::__cxx11::string::~string((string *)&quoted_field_name);
  }
  return bVar1;
}

Assistant:

bool WireFormatLite::VerifyUtf8String(const char* data,
                                      int size,
                                      Operation op,
                                      const char* field_name) {
  if (!IsStructurallyValidUTF8(data, size)) {
    const char* operation_str = NULL;
    switch (op) {
      case PARSE:
        operation_str = "parsing";
        break;
      case SERIALIZE:
        operation_str = "serializing";
        break;
      // no default case: have the compiler warn if a case is not covered.
    }
    string quoted_field_name = "";
    if (field_name != NULL) {
      quoted_field_name = StringPrintf(" '%s'", field_name);
    }
    // no space below to avoid double space when the field name is missing.
    GOOGLE_LOG(ERROR) << "String field" << quoted_field_name << " contains invalid "
               << "UTF-8 data when " << operation_str << " a protocol "
               << "buffer. Use the 'bytes' type if you intend to send raw "
               << "bytes. ";
    return false;
  }
  return true;
}